

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_chatwindow.h
# Opt level: O2

void __thiscall Ui_ChatWindow::setupUi(Ui_ChatWindow *this,QWidget *ChatWindow)

{
  storage_type *psVar1;
  QGridLayout *this_00;
  QPushButton *pQVar2;
  QListView *this_01;
  QLineEdit *this_02;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QArrayDataPointer<char16_t> local_48;
  
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (local_48.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("ChatWindow",0xb);
    QVar3.m_data = psVar1;
    QVar3.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar3);
    QObject::setObjectName((QString *)ChatWindow);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QWidget::resize(ChatWindow,400,300);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,ChatWindow);
  this->gridLayout = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("gridLayout",0xb);
  QVar4.m_data = psVar1;
  QVar4.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar4);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  pQVar2 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar2,ChatWindow);
  this->connectButton = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("connectButton",0xe);
  QVar5.m_data = psVar1;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QGridLayout::addWidget(this->gridLayout,this->connectButton,0,0,1,2,0);
  this_01 = (QListView *)operator_new(0x28);
  QListView::QListView(this_01,ChatWindow);
  this->chatView = this_01;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("chatView",9);
  QVar6.m_data = psVar1;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::setEnabled(SUB81(this->chatView,0));
  QAbstractItemView::setEditTriggers(this->chatView,0);
  QGridLayout::addWidget(this->gridLayout,this->chatView,1,0,1,2,0);
  this_02 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(this_02,ChatWindow);
  this->messageEdit = this_02;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("messageEdit",0xc);
  QVar7.m_data = psVar1;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::setEnabled(SUB81(this->messageEdit,0));
  QGridLayout::addWidget(this->gridLayout,this->messageEdit,2,0,1,1,0);
  pQVar2 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar2,ChatWindow);
  this->sendButton = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("sendButton",0xb);
  QVar8.m_data = psVar1;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::setEnabled(SUB81(this->sendButton,0));
  QGridLayout::addWidget(this->gridLayout,this->sendButton,2,1,1,1,0);
  retranslateUi(this,ChatWindow);
  QPushButton::setDefault(SUB81(this->sendButton,0));
  QMetaObject::connectSlotsByName((QObject *)ChatWindow);
  return;
}

Assistant:

void setupUi(QWidget *ChatWindow)
    {
        if (ChatWindow->objectName().isEmpty())
            ChatWindow->setObjectName(QString::fromUtf8("ChatWindow"));
        ChatWindow->resize(400, 300);
        gridLayout = new QGridLayout(ChatWindow);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        connectButton = new QPushButton(ChatWindow);
        connectButton->setObjectName(QString::fromUtf8("connectButton"));

        gridLayout->addWidget(connectButton, 0, 0, 1, 2);

        chatView = new QListView(ChatWindow);
        chatView->setObjectName(QString::fromUtf8("chatView"));
        chatView->setEnabled(false);
        chatView->setEditTriggers(QAbstractItemView::NoEditTriggers);

        gridLayout->addWidget(chatView, 1, 0, 1, 2);

        messageEdit = new QLineEdit(ChatWindow);
        messageEdit->setObjectName(QString::fromUtf8("messageEdit"));
        messageEdit->setEnabled(false);

        gridLayout->addWidget(messageEdit, 2, 0, 1, 1);

        sendButton = new QPushButton(ChatWindow);
        sendButton->setObjectName(QString::fromUtf8("sendButton"));
        sendButton->setEnabled(false);

        gridLayout->addWidget(sendButton, 2, 1, 1, 1);


        retranslateUi(ChatWindow);

        sendButton->setDefault(true);


        QMetaObject::connectSlotsByName(ChatWindow);
    }